

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_vertexbuffer.cpp
# Opt level: O1

int __thiscall
FFlatVertexBuffer::CreateSubsectorVertices
          (FFlatVertexBuffer *this,subsector_t *sub,secplane_t *plane,int floor)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  bool bVar7;
  uint uVar8;
  seg_t *psVar9;
  double *pdVar10;
  uint uVar11;
  float *pfVar12;
  long lVar13;
  float fVar14;
  
  uVar8 = sub->numlines;
  TArray<FFlatVertex,_FFlatVertex>::Grow(&this->vbo_shadowdata,uVar8);
  uVar11 = (this->vbo_shadowdata).Count;
  (this->vbo_shadowdata).Count = uVar8 + uVar11;
  uVar8 = sub->numlines;
  if ((ulong)uVar8 != 0) {
    psVar9 = sub->firstline;
    dVar1 = plane->D;
    dVar2 = (plane->normal).X;
    dVar3 = (plane->normal).Y;
    dVar4 = plane->negiC;
    bVar7 = sub->sector->transdoor;
    pfVar12 = &(this->vbo_shadowdata).Array[(int)uVar11].v;
    uVar11 = uVar11 + uVar8;
    lVar13 = 0;
    do {
      pdVar10 = *(double **)((long)&psVar9->v1 + lVar13);
      dVar5 = *pdVar10;
      ((FFlatVertex *)(pfVar12 + -4))->x = (float)dVar5;
      dVar6 = pdVar10[1];
      pfVar12[-2] = (float)dVar6;
      fVar14 = (float)((dVar3 * dVar6 + dVar2 * dVar5 + dVar1) * dVar4);
      pfVar12[-3] = fVar14;
      pfVar12[-1] = (float)(dVar5 * 0.015625);
      *pfVar12 = (float)(dVar6 * -0.015625);
      if ((floor != 0 & bVar7) != 0) {
        pfVar12[-3] = fVar14 + -1.0;
      }
      pfVar12 = pfVar12 + 5;
      lVar13 = lVar13 + 0x48;
    } while ((ulong)uVar8 * 0x48 != lVar13);
  }
  return uVar11;
}

Assistant:

int FFlatVertexBuffer::CreateSubsectorVertices(subsector_t *sub, const secplane_t &plane, int floor)
{
	int idx = vbo_shadowdata.Reserve(sub->numlines);
	for(unsigned int k=0; k<sub->numlines; k++, idx++)
	{
		vbo_shadowdata[idx].SetFlatVertex(sub->firstline[k].v1, plane);
		if (sub->sector->transdoor && floor) vbo_shadowdata[idx].z -= 1.f;
	}
	return idx;
}